

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall
LinearScan::GeneratorBailIn::InsertRestoreSymbols
          (GeneratorBailIn *this,BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUses,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses,CapturedValues *capturedValues,
          BailInInsertionPoint *insertionPoint)

{
  ushort uVar1;
  Lifetime *lifetime;
  Func *func;
  code *pcVar2;
  undefined4 *puVar3;
  bool bVar4;
  byte bVar5;
  RegSlot regSlot;
  uint32 offset;
  Type *pTVar6;
  StackSym *this_00;
  StackSym *this_01;
  IndirOpnd *src;
  Instr *instr;
  SymOpnd *dst;
  RegOpnd *pRVar7;
  Instr *pIVar8;
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *pSVar9;
  BailInInsertionPoint *pBVar10;
  Iterator local_58;
  Instr *local_48;
  BailInInsertionPoint *local_40;
  undefined4 *local_38;
  
  pSVar9 = this->bailInSymbols;
  local_58.list = pSVar9;
  local_58.current = &pSVar9->super_SListNodeBase<Memory::ArenaAllocator>;
  local_40 = insertionPoint;
  local_38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    if (pSVar9 == (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = local_38;
      *local_38 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
LAB_0058ae4e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar3 = 0;
      pSVar9 = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                *)local_58.current;
    }
    local_58.current = (pSVar9->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *)
        local_58.current == local_58.list) {
      return;
    }
    pTVar6 = SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data(&local_58);
    this_00 = SymTable::FindStackSym(this->func->m_symTable,pTVar6->toBackendId);
    lifetime = *(Lifetime **)&(this_00->scratch).globOpt;
    if (lifetime == (Lifetime *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = local_38;
      *local_38 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1461,"(lifetime)","lifetime");
      if (!bVar4) goto LAB_0058ae4e;
      *puVar3 = 0;
    }
    this_01 = SymTable::FindStackSym(this->func->m_symTable,pTVar6->fromByteCodeRegSlot);
    regSlot = StackSym::GetByteCodeRegSlot(this_01);
    if ((pTVar6->field_0x8 & 1) == 0) {
      pRVar7 = this->interpreterFrameRegOpnd;
      offset = GetOffsetFromInterpreterStackFrame(this,regSlot);
      src = IR::IndirOpnd::New(pRVar7,offset,this_01->m_type,this->func,false);
    }
    else {
      src = (IndirOpnd *)
            IR::AddrOpnd::New(pTVar6->constValue,AddrOpndKindDynamicVar,this->func,false,(Var)0x0);
    }
    uVar1 = *(ushort *)&lifetime->field_0x9c;
    bVar4 = StackSym::IsConst(this_00);
    pBVar10 = local_40;
    if ((uVar1 & 1) == 0) {
      if (bVar4) {
        instr = InsertLoad(this->linearScan,local_40->instrInsertRegSym,this_00,lifetime->reg);
      }
      else {
        pRVar7 = IR::RegOpnd::New(this_00,this_00->m_type,this->func);
        pBVar10 = local_40;
        pRVar7->m_reg = lifetime->reg;
        instr = InsertMove(&pRVar7->super_Opnd,&src->super_Opnd,local_40->instrInsertRegSym);
      }
      pIVar8 = pBVar10->instrInsertStackSym;
      if (pBVar10->instrInsertRegSym == pBVar10->instrInsertStackSym) {
        pBVar10->instrInsertStackSym = instr;
        pIVar8 = instr;
      }
      if (lifetime->reg == this->interpreterFrameRegOpnd->m_reg) {
        if (pBVar10->instrInsertRegSym == pIVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = local_38;
          *local_38 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x14a0,
                             "(insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym)"
                             ,
                             "insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym"
                            );
          if (!bVar4) goto LAB_0058ae4e;
          *puVar3 = 0;
        }
        pBVar10->instrInsertRegSym = instr;
        if (pBVar10->raxRestoreInstr != (Instr *)0x0) {
          IR::Instr::FreeSrc1(pBVar10->raxRestoreInstr);
          local_48 = pBVar10->raxRestoreInstr;
          pRVar7 = this->interpreterFrameRegOpnd;
          if (local_48->m_src1 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = local_38;
            *local_38 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar4) goto LAB_0058ae4e;
            *puVar3 = 0;
          }
          func = local_48->m_func;
          if ((pRVar7->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = local_38;
            *local_38 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar4) goto LAB_0058ae4e;
            *puVar3 = 0;
          }
          pIVar8 = local_48;
          bVar5 = (pRVar7->super_Opnd).field_0xb;
          if ((bVar5 & 2) != 0) {
            pRVar7 = (RegOpnd *)IR::Opnd::Copy(&pRVar7->super_Opnd,func);
            bVar5 = (pRVar7->super_Opnd).field_0xb;
          }
          (pRVar7->super_Opnd).field_0xb = bVar5 | 2;
          pIVar8->m_src1 = &pRVar7->super_Opnd;
          pBVar10 = local_40;
        }
        pBVar10->raxRestoreInstr = instr;
      }
      RecordDef(this->linearScan,lifetime,instr,0);
      pSVar9 = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                *)local_58.current;
    }
    else {
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = local_38;
        *local_38 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x1478,"(!dstSym->IsConst())",
                           "We don\'t need to restore constant symbol that has already been spilled"
                          );
        if (!bVar4) goto LAB_0058ae4e;
        *puVar3 = 0;
      }
      this_00->field_0x19 = this_00->field_0x19 | 0x10;
      dst = IR::SymOpnd::New(&this_00->super_Sym,this_00->m_type,this->func);
      pBVar10 = local_40;
      InsertMove(&this->tempRegOpnd->super_Opnd,&src->super_Opnd,local_40->instrInsertStackSym);
      InsertMove(&dst->super_Opnd,&this->tempRegOpnd->super_Opnd,pBVar10->instrInsertStackSym);
      pSVar9 = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                *)local_58.current;
    }
  } while( true );
}

Assistant:

void LinearScan::GeneratorBailIn::InsertRestoreSymbols(
    const BVSparse<JitArenaAllocator>& byteCodeUpwardExposedUses,
    const BVSparse<JitArenaAllocator>& upwardExposedUses,
    const CapturedValues& capturedValues,
    BailInInsertionPoint& insertionPoint
)
{
    FOREACH_SLISTBASE_ENTRY(BailInSymbol, bailInSymbol, this->bailInSymbols)
    {
        StackSym* dstSym = this->func->m_symTable->FindStackSym(bailInSymbol.toBackendId);
        Lifetime* lifetime = dstSym->scratch.linearScan.lifetime;
        Assert(lifetime);

        StackSym* copyPropStackSym = this->func->m_symTable->FindStackSym(bailInSymbol.fromByteCodeRegSlot);
        Js::RegSlot regSlot = copyPropStackSym->GetByteCodeRegSlot();
        IR::Opnd* srcOpnd;
        
        if (bailInSymbol.restoreConstDirectly)
        {
            srcOpnd = IR::AddrOpnd::New(bailInSymbol.constValue, IR::AddrOpndKind::AddrOpndKindDynamicVar, this->func);
        }
        else
        {
            srcOpnd = IR::IndirOpnd::New(
                this->interpreterFrameRegOpnd,
                this->GetOffsetFromInterpreterStackFrame(regSlot),
                copyPropStackSym->GetType(),
                this->func
            );
        }

        if (lifetime->isSpilled)
        {
#if DBG
            AssertMsg(!dstSym->IsConst(), "We don't need to restore constant symbol that has already been spilled");
            // Supress assert in DbPostCheckLower
            dstSym->m_allocated = true;
#endif
            // Stack restores require an extra register since we can't move an indir directly to an indir on amd64
            IR::SymOpnd* dstOpnd = IR::SymOpnd::New(dstSym, dstSym->GetType(), this->func);
            LinearScan::InsertMove(this->tempRegOpnd, srcOpnd, insertionPoint.instrInsertStackSym);
            LinearScan::InsertMove(dstOpnd, this->tempRegOpnd, insertionPoint.instrInsertStackSym);
        }
        else
        {
            // Register restores must come after stack restores so that we have RAX and RCX free to
            // use for stack restores and further RAX must be restored last since it holds the
            // pointer to the InterpreterStackFrame from which we are restoring values.
            // We must also track these restores using RecordDef in case the symbols are spilled.

            IR::Instr* instr;

            if (dstSym->IsConst())
            {
                instr = this->linearScan->InsertLoad(insertionPoint.instrInsertRegSym, dstSym, lifetime->reg);
            }
            else
            {
                IR::RegOpnd* dstRegOpnd = IR::RegOpnd::New(dstSym, dstSym->GetType(), this->func);
                dstRegOpnd->SetReg(lifetime->reg);
                instr = LinearScan::InsertMove(dstRegOpnd, srcOpnd, insertionPoint.instrInsertRegSym);
            }

            if (insertionPoint.instrInsertRegSym == insertionPoint.instrInsertStackSym)
            {
                // This is the first register sym, make sure we don't insert stack stores
                // after this instruction so we can ensure rax and rcx remain free to use
                // for restoring spilled stack syms.
                insertionPoint.instrInsertStackSym = instr;
            }

            if (lifetime->reg == interpreterFrameRegOpnd->GetReg())
            {
                // Ensure rax is restored last
                Assert(insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym);

                insertionPoint.instrInsertRegSym = instr;

                if (insertionPoint.raxRestoreInstr != nullptr)
                {
                    // rax was mapped to multiple bytecode registers. Obviously only the first
                    // restore we do will work so change all following stores to `mov rax, rax`.
                    // We still need to keep them around for RecordDef in case the corresponding
                    // dst sym is spilled later on.
                    insertionPoint.raxRestoreInstr->FreeSrc1();
                    insertionPoint.raxRestoreInstr->SetSrc1(this->interpreterFrameRegOpnd);
                }

                insertionPoint.raxRestoreInstr = instr;
            }

            this->linearScan->RecordDef(lifetime, instr, 0);
        }
    }
    NEXT_SLISTBASE_ENTRY;
}